

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
::grow(DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
       *this,uint AtLeast)

{
  uint64_t uVar1;
  uint *puVar2;
  uint local_28 [2];
  DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *local_20;
  DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *OldBuckets;
  uint OldNumBuckets;
  uint AtLeast_local;
  DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
  *this_local;
  
  OldBuckets._0_4_ = this->NumBuckets;
  local_20 = this->Buckets;
  local_28[1] = 0x40;
  OldBuckets._4_4_ = AtLeast;
  _OldNumBuckets = this;
  uVar1 = NextPowerOf2((ulong)(AtLeast - 1));
  local_28[0] = (uint)uVar1;
  puVar2 = std::max<unsigned_int>(local_28 + 1,local_28);
  allocateBuckets(this,*puVar2);
  if (this->Buckets != (DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *)0x0)
  {
    if (local_20 == (DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *)0x0) {
      DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
      ::initEmpty((DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
                   *)this);
    }
    else {
      DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
      ::moveFromOldBuckets
                ((DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
                  *)this,local_20,local_20 + (uint)OldBuckets);
      deallocate_buffer(local_20,(ulong)(uint)OldBuckets << 4,8);
    }
    return;
  }
  __assert_fail("Buckets",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                ,0x309,
                "void llvm::DenseMap<unsigned long, const llvm::DWARFDebugNames::NameIndex *>::grow(unsigned int) [KeyT = unsigned long, ValueT = const llvm::DWARFDebugNames::NameIndex *, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseMapPair<unsigned long, const llvm::DWARFDebugNames::NameIndex *>]"
               );
}

Assistant:

void grow(unsigned AtLeast) {
    unsigned OldNumBuckets = NumBuckets;
    BucketT *OldBuckets = Buckets;

    allocateBuckets(std::max<unsigned>(64, static_cast<unsigned>(NextPowerOf2(AtLeast-1))));
    assert(Buckets);
    if (!OldBuckets) {
      this->BaseT::initEmpty();
      return;
    }

    this->moveFromOldBuckets(OldBuckets, OldBuckets+OldNumBuckets);

    // Free the old table.
    deallocate_buffer(OldBuckets, sizeof(BucketT) * OldNumBuckets,
                      alignof(BucketT));
  }